

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O3

string * __thiscall
kratos::EnableStmtVisitor::get_ssa_enable_condition_abi_cxx11_
          (string *__return_storage_ptr__,EnableStmtVisitor *this,Var *target)

{
  pointer pcVar1;
  _Hash_node_base *p_Var2;
  undefined1 this_00 [8];
  pointer begin;
  Var *extraout_RDX;
  Var *extraout_RDX_00;
  Var *extraout_RDX_01;
  string *in_R8;
  _Hash_node_base *p_Var3;
  undefined1 auStack_78 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  str_values;
  undefined1 local_58 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> val;
  
  auStack_78 = (undefined1  [8])0x0;
  str_values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  str_values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var3 = (_Hash_node_base *)(this->values)._M_h._M_bucket_count;
  p_Var2 = (this->values)._M_h._M_before_begin._M_nxt;
  if (p_Var3 != p_Var2) {
    do {
      get_ssa_en_abi_cxx11_
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_58,(EnableStmtVisitor *)p_Var3->_M_nxt,(Attribute *)target);
      target = extraout_RDX;
      if (val.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._24_1_ == '\x01') {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
        target = extraout_RDX_00;
      }
      if (((val.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._24_1_ & 1) != 0) &&
         (val.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._24_1_ = 0,
         local_58 !=
         (undefined1  [8])
         ((long)&val.
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload + 8))) {
        operator_delete((void *)local_58,
                        val.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._M_value._M_string_length + 1);
        target = extraout_RDX_01;
      }
      p_Var3 = p_Var3 + 2;
    } while (p_Var3 != p_Var2);
  }
  begin = str_values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  this_00 = auStack_78;
  pcVar1 = (pointer)((long)&val.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload + 8);
  local_58 = (undefined1  [8])pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58," and ","");
  string::
  join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (__return_storage_ptr__,(string *)this_00,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )begin,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
             in_R8);
  if (local_58 != (undefined1  [8])pcVar1) {
    operator_delete((void *)local_58,
                    val.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._M_value._M_string_length + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_78);
  return __return_storage_ptr__;
}

Assistant:

static std::string get_ssa_enable_condition(Var* target) {
        std::vector<std::string> str_values;
        // check attributes
        auto const& attrs = target->get_attributes();
        if (!attrs.empty()) {
            for (auto const& attr : attrs) {
                auto val = get_ssa_en(attr.get());
                if (val) str_values.emplace_back(*val);
            }
        }

        return string::join(str_values.begin(), str_values.end(), " and ");
    }